

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O2

void FIX::deleteSession(string *sender,string *target)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"store/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".messages");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"store/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".header");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"store/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".seqnums");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"store/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".session");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline void deleteSession( std::string sender, std::string target )
{
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".messages" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".header" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".seqnums" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".session" ).c_str() );
}